

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

DdManager * cuddInitTable(uint numVars,uint numVarsZ,uint numSlots,uint looseUpTo)

{
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint value;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  DdManager *__ptr;
  DdSubtable *pDVar9;
  DdSubtable *pDVar10;
  DdSubtable *__ptr_00;
  DdSubtable *__ptr_01;
  DdSubtable *__ptr_02;
  DdSubtable *pDVar11;
  DdNode **ppDVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_58;
  int iStack_54;
  
  __ptr = (DdManager *)malloc(0x2f8);
  if (__ptr == (DdManager *)0x0) {
    return (DdManager *)0x0;
  }
  (__ptr->sentinel).type.value = 0.0;
  (__ptr->sentinel).type.kids.E = (DdNode *)0x0;
  (__ptr->sentinel).index = 0;
  (__ptr->sentinel).ref = 0;
  (__ptr->sentinel).next = (DdNode *)0x0;
  __ptr->epsilon = 1e-12;
  __ptr->maxGrowth = 1.1;
  __ptr->maxGrowthAlt = 2.2;
  __ptr->reordCycle = 0;
  __ptr->size = numVars;
  __ptr->sizeZ = numVarsZ;
  uVar6 = 10;
  if (10 < numVars) {
    uVar6 = numVars;
  }
  __ptr->maxSize = uVar6;
  uVar6 = 10;
  if (10 < numVarsZ) {
    uVar6 = numVarsZ;
  }
  __ptr->maxSizeZ = uVar6;
  uVar6 = 8;
  do {
    value = uVar6;
    uVar6 = value * 2;
  } while (value < numSlots);
  __ptr->initSlots = value;
  iVar5 = cuddComputeFloorLog2(value);
  uVar6 = (numVars + numVarsZ + 1) * value;
  __ptr->slots = uVar6;
  __ptr->maxLive = 0xffffffff;
  __ptr->keys = 0;
  __ptr->keysZ = 0;
  __ptr->dead = 0;
  __ptr->deadZ = 0;
  __ptr->gcFrac = 4.0;
  __ptr->minDead = uVar6 * 4;
  __ptr->looseUpTo = looseUpTo;
  __ptr->gcEnabled = 1;
  __ptr->allocated = 0;
  __ptr->reclaimed = 0.0;
  iVar7 = __ptr->maxSize;
  pDVar9 = (DdSubtable *)malloc((long)iVar7 * 0x38);
  __ptr->subtables = pDVar9;
  if (pDVar9 == (DdSubtable *)0x0) goto LAB_0079d423;
  iVar8 = __ptr->maxSizeZ;
  pDVar10 = (DdSubtable *)malloc((long)iVar8 * 0x38);
  __ptr->subtableZ = pDVar10;
  if (pDVar10 != (DdSubtable *)0x0) {
    sVar1 = (long)iVar7 * 4;
    __ptr_00 = (DdSubtable *)malloc(sVar1);
    __ptr->perm = (int *)__ptr_00;
    if (__ptr_00 == (DdSubtable *)0x0) {
      free(pDVar9);
      pDVar9 = pDVar10;
    }
    else {
      __ptr_01 = (DdSubtable *)malloc(sVar1);
      __ptr->invperm = (int *)__ptr_01;
      if (__ptr_01 == (DdSubtable *)0x0) {
        free(pDVar9);
        free(pDVar10);
        pDVar9 = __ptr_00;
      }
      else {
        sVar1 = (long)iVar8 * 4;
        __ptr_02 = (DdSubtable *)malloc(sVar1);
        __ptr->permZ = (int *)__ptr_02;
        if (__ptr_02 == (DdSubtable *)0x0) {
          free(pDVar9);
          free(pDVar10);
          free(__ptr_00);
          pDVar9 = __ptr_01;
        }
        else {
          pDVar11 = (DdSubtable *)malloc(sVar1);
          __ptr->invpermZ = (int *)pDVar11;
          if (pDVar11 == (DdSubtable *)0x0) {
            free(pDVar9);
            free(pDVar10);
            free(__ptr_00);
            free(__ptr_01);
            pDVar9 = __ptr_02;
          }
          else {
            __ptr->map = (int *)0x0;
            if (iVar7 < iVar8) {
              iVar7 = iVar8;
            }
            ppDVar12 = (DdNode **)malloc((long)iVar7 * 8 + 8);
            __ptr->stack = ppDVar12;
            if (ppDVar12 == (DdNode **)0x0) {
              free(pDVar9);
              free(pDVar10);
              free(__ptr_00);
              free(__ptr_01);
              free(__ptr_02);
              pDVar9 = pDVar11;
            }
            else {
              *ppDVar12 = (DdNode *)0x0;
              iVar7 = cuddComputeFloorLog2(looseUpTo >> 2);
              uVar6 = 1 << ((byte)iVar7 & 0x1f);
              __ptr->deathRowDepth = uVar6;
              ppDVar12 = (DdNode **)malloc((long)(int)uVar6 << 3);
              __ptr->deathRow = ppDVar12;
              if (ppDVar12 == (DdNode **)0x0) {
                pDVar9 = __ptr->subtables;
                if (pDVar9 != (DdSubtable *)0x0) {
LAB_0079d376:
                  free(pDVar9);
                  __ptr->subtables = (DdSubtable *)0x0;
                }
                pDVar9 = __ptr->subtableZ;
LAB_0079d38d:
                if (pDVar9 != (DdSubtable *)0x0) goto LAB_0079d392;
              }
              else {
                if (iVar7 != 0x1f) {
                  uVar13 = 1;
                  if (1 < (int)uVar6) {
                    uVar13 = (ulong)uVar6;
                  }
                  uVar14 = 0;
                  do {
                    __ptr->deathRow[uVar14] = (DdNode *)0x0;
                    uVar14 = uVar14 + 1;
                  } while (uVar13 != uVar14);
                }
                iVar5 = 0x20 - iVar5;
                __ptr->nextDead = 0;
                __ptr->deadMask = uVar6 - 1;
                uVar13 = (ulong)value;
                if (numVars != 0) {
                  pDVar9 = __ptr->subtables;
                  lVar17 = uVar13 - 1;
                  auVar19._8_4_ = (int)lVar17;
                  auVar19._0_8_ = lVar17;
                  auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  auVar19 = auVar19 ^ _DAT_007ee2e0;
                  uVar14 = 0;
                  do {
                    pDVar9[uVar14].slots = value;
                    pDVar9[uVar14].shift = iVar5;
                    pDVar9[uVar14].keys = 0;
                    pDVar9[uVar14].dead = 0;
                    pDVar9[uVar14].maxKeys = value * 4;
                    ppDVar12 = (DdNode **)malloc(uVar13 * 8);
                    pDVar10 = pDVar9 + uVar14;
                    pDVar10->bindVar = 0;
                    pDVar10->varType = CUDD_VAR_PRIMARY_INPUT;
                    pDVar10->pairIndex = 0;
                    pDVar10->varHandled = 0;
                    pDVar9[uVar14].varToBeGrouped = CUDD_LAZY_NONE;
                    pDVar9[uVar14].nodelist = ppDVar12;
                    auVar4 = _DAT_007ee2e0;
                    if (ppDVar12 == (DdNode **)0x0) {
                      if (uVar14 != 0) {
                        lVar17 = 0;
                        do {
                          pvVar2 = *(void **)((long)&pDVar9->nodelist + lVar17);
                          if (pvVar2 != (void *)0x0) {
                            free(pvVar2);
                            pDVar9 = __ptr->subtables;
                            *(undefined8 *)((long)&pDVar9->nodelist + lVar17) = 0;
                          }
                          lVar17 = lVar17 + 0x38;
                          uVar14 = uVar14 - 1;
                        } while (uVar14 != 0);
                      }
                      goto LAB_0079d376;
                    }
                    local_58 = auVar19._0_4_;
                    iStack_54 = auVar19._4_4_;
                    if (value != 0) {
                      uVar15 = 0;
                      auVar18 = _DAT_007ee2d0;
                      do {
                        bVar3 = local_58 < SUB164(auVar18 ^ auVar4,0);
                        iVar7 = SUB164(auVar18 ^ auVar4,4);
                        if ((bool)(~(iStack_54 < iVar7 || iVar7 == iStack_54 && bVar3) & 1)) {
                          ppDVar12[uVar15] = (DdNode *)__ptr;
                        }
                        if (iStack_54 >= iVar7 && (iVar7 != iStack_54 || !bVar3)) {
                          ppDVar12[uVar15 + 1] = (DdNode *)__ptr;
                        }
                        uVar15 = uVar15 + 2;
                        lVar17 = auVar18._8_8_;
                        auVar18._0_8_ = auVar18._0_8_ + 2;
                        auVar18._8_8_ = lVar17 + 2;
                      } while (uVar13 != uVar15);
                    }
                    __ptr->perm[uVar14] = (int)uVar14;
                    __ptr->invperm[uVar14] = (int)uVar14;
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != numVars);
                }
                if (numVarsZ != 0) {
                  puVar16 = &__ptr->subtableZ->dead;
                  uVar14 = 0;
LAB_0079d20e:
                  puVar16[-3] = value;
                  puVar16[-4] = iVar5;
                  puVar16[-2] = 0;
                  *puVar16 = 0;
                  puVar16[-1] = value * 4;
                  ppDVar12 = (DdNode **)malloc(uVar13 << 3);
                  ((DdSubtable *)(puVar16 + -6))->nodelist = ppDVar12;
                  if (ppDVar12 != (DdNode **)0x0) goto code_r0x0079d23e;
                  pDVar9 = __ptr->subtables;
                  if (numVars == 0) {
                    if (pDVar9 == (DdSubtable *)0x0) goto LAB_0079d654;
                  }
                  else {
                    lVar17 = 0;
                    do {
                      pvVar2 = *(void **)((long)&pDVar9->nodelist + lVar17);
                      if (pvVar2 != (void *)0x0) {
                        free(pvVar2);
                        pDVar9 = __ptr->subtables;
                        *(undefined8 *)((long)&pDVar9->nodelist + lVar17) = 0;
                      }
                      lVar17 = lVar17 + 0x38;
                    } while ((ulong)numVars * 0x38 - lVar17 != 0);
                  }
                  free(pDVar9);
                  __ptr->subtables = (DdSubtable *)0x0;
LAB_0079d654:
                  pDVar9 = __ptr->subtableZ;
                  if (uVar14 == 0) goto LAB_0079d38d;
                  lVar17 = 0;
                  do {
                    pvVar2 = *(void **)((long)&pDVar9->nodelist + lVar17);
                    if (pvVar2 != (void *)0x0) {
                      free(pvVar2);
                      pDVar9 = __ptr->subtableZ;
                      *(undefined8 *)((long)&pDVar9->nodelist + lVar17) = 0;
                    }
                    lVar17 = lVar17 + 0x38;
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                  goto LAB_0079d392;
                }
LAB_0079d44b:
                (__ptr->constants).slots = value;
                (__ptr->constants).shift = iVar5;
                (__ptr->constants).keys = 0;
                (__ptr->constants).dead = 0;
                (__ptr->constants).maxKeys = value * 4;
                ppDVar12 = (DdNode **)malloc(uVar13 << 3);
                (__ptr->constants).nodelist = ppDVar12;
                if (ppDVar12 != (DdNode **)0x0) {
                  if (value != 0) {
                    memset(ppDVar12,0,uVar13 << 3);
                  }
                  __ptr->memoryList = (DdNode **)0x0;
                  __ptr->nextFree = (DdNode *)0x0;
                  iVar5 = __ptr->maxSize;
                  iVar7 = __ptr->maxSizeZ;
                  iVar8 = iVar5;
                  if (iVar5 < iVar7) {
                    iVar8 = iVar7;
                  }
                  __ptr->memused =
                       (long)(iVar7 + iVar5) * 0x40 + (ulong)(value * (numVars + 1)) * 8 +
                       (long)iVar8 * 8 + 0x300 + (long)__ptr->deathRowDepth * 8;
                  __ptr->autoDyn = 0;
                  __ptr->autoDynZ = 0;
                  __ptr->autoMethod = CUDD_REORDER_SIFT;
                  __ptr->autoMethodZ = CUDD_REORDER_SIFT;
                  __ptr->realign = 0;
                  __ptr->realignZ = 0;
                  __ptr->nextDyn = 0xfa4;
                  __ptr->countDead = 0xffffffff;
                  __ptr->reordered = 0;
                  __ptr->reorderings = 0;
                  __ptr->siftMaxVar = 1000;
                  __ptr->siftMaxSwap = 2000000;
                  __ptr->tree = (MtrNode *)0x0;
                  __ptr->treeZ = (MtrNode *)0x0;
                  __ptr->groupcheck = CUDD_GROUP_CHECK7;
                  __ptr->linear = (long *)0x0;
                  __ptr->linearSize = 0;
                  __ptr->univ = (DdNode **)0x0;
                  __ptr->recomb = 0;
                  __ptr->symmviolation = 0;
                  __ptr->arcviolation = 0;
                  __ptr->populationSize = 0;
                  __ptr->populationSize = 0;
                  __ptr->numberXovers = 0;
                  __ptr->localCaches = (DdLocalCache *)0x0;
                  __ptr->preGCHook = (DdHook *)0x0;
                  __ptr->postGCHook = (DdHook *)0x0;
                  __ptr->preReorderingHook = (DdHook *)0x0;
                  __ptr->postReorderingHook = (DdHook *)0x0;
                  __ptr->out = _stdout;
                  __ptr->err = _stderr;
                  __ptr->errorCode = CUDD_NO_ERROR;
                  __ptr->maxmemhard = 0xffffffffffffffff;
                  __ptr->garbageCollections = 0;
                  __ptr->peakLiveNodes = 0;
                  __ptr->GCTime = 0;
                  __ptr->reordTime = 0;
                  return __ptr;
                }
                pDVar9 = __ptr->subtables;
                if (numVars == 0) {
                  if (pDVar9 != (DdSubtable *)0x0) goto LAB_0079d69a;
                }
                else {
                  lVar17 = 0;
                  do {
                    pvVar2 = *(void **)((long)&pDVar9->nodelist + lVar17);
                    if (pvVar2 != (void *)0x0) {
                      free(pvVar2);
                      pDVar9 = __ptr->subtables;
                      *(undefined8 *)((long)&pDVar9->nodelist + lVar17) = 0;
                    }
                    lVar17 = lVar17 + 0x38;
                  } while ((ulong)numVars * 0x38 - lVar17 != 0);
LAB_0079d69a:
                  free(pDVar9);
                  __ptr->subtables = (DdSubtable *)0x0;
                }
                pDVar9 = __ptr->subtableZ;
                if (numVarsZ == 0) goto LAB_0079d38d;
                lVar17 = 0;
                do {
                  pvVar2 = *(void **)((long)&pDVar9->nodelist + lVar17);
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                    pDVar9 = __ptr->subtableZ;
                    *(undefined8 *)((long)&pDVar9->nodelist + lVar17) = 0;
                  }
                  lVar17 = lVar17 + 0x38;
                } while ((ulong)numVarsZ * 0x38 - lVar17 != 0);
LAB_0079d392:
                free(pDVar9);
                __ptr->subtableZ = (DdSubtable *)0x0;
              }
              if (__ptr->perm != (int *)0x0) {
                free(__ptr->perm);
                __ptr->perm = (int *)0x0;
              }
              if (__ptr->invperm != (int *)0x0) {
                free(__ptr->invperm);
                __ptr->invperm = (int *)0x0;
              }
              if (__ptr->permZ != (int *)0x0) {
                free(__ptr->permZ);
                __ptr->permZ = (int *)0x0;
              }
              if (__ptr->invpermZ != (int *)0x0) {
                free(__ptr->invpermZ);
                __ptr->invpermZ = (int *)0x0;
              }
              pDVar9 = (DdSubtable *)__ptr->stack;
              if ((DdSubtable *)__ptr->stack == (DdSubtable *)0x0) goto LAB_0079d423;
            }
          }
        }
      }
    }
  }
  free(pDVar9);
LAB_0079d423:
  free(__ptr);
  return (DdManager *)0x0;
code_r0x0079d23e:
  if (value != 0) {
    memset(ppDVar12,0,uVar13 << 3);
  }
  __ptr->permZ[uVar14] = (int)uVar14;
  __ptr->invpermZ[uVar14] = (int)uVar14;
  uVar14 = uVar14 + 1;
  puVar16 = puVar16 + 0xe;
  if (numVarsZ == uVar14) goto LAB_0079d44b;
  goto LAB_0079d20e;
}

Assistant:

DdManager *
cuddInitTable(
  unsigned int numVars  /* Initial number of BDD variables (and subtables) */,
  unsigned int numVarsZ /* Initial number of ZDD variables (and subtables) */,
  unsigned int numSlots /* Initial size of the BDD subtables */,
  unsigned int looseUpTo /* Limit for fast table growth */)
{
    DdManager   *unique = ABC_ALLOC(DdManager,1);
    int         i, j;
    DdNodePtr   *nodelist;
    DdNode      *sentinel;
    unsigned int slots;
    int shift;

    if (unique == NULL) {
        return(NULL);
    }
    sentinel = &(unique->sentinel);
    sentinel->ref = 0;
    sentinel->index = 0;
    cuddT(sentinel) = NULL;
    cuddE(sentinel) = NULL;
    sentinel->next = NULL;
    unique->epsilon = DD_EPSILON;
    unique->maxGrowth = DD_MAX_REORDER_GROWTH;
    unique->maxGrowthAlt = 2.0 * DD_MAX_REORDER_GROWTH;
    unique->reordCycle = 0;     /* do not use alternate threshold */
    unique->size = numVars;
    unique->sizeZ = numVarsZ;
    unique->maxSize = ddMax(DD_DEFAULT_RESIZE, numVars);
    unique->maxSizeZ = ddMax(DD_DEFAULT_RESIZE, numVarsZ);

    /* Adjust the requested number of slots to a power of 2. */
    slots = 8;
    while (slots < numSlots) {
        slots <<= 1;
    }
    unique->initSlots = slots;
    shift = sizeof(int) * 8 - cuddComputeFloorLog2(slots);

    unique->slots = (numVars + numVarsZ + 1) * slots;
    unique->keys = 0;
    unique->maxLive = ~0;       /* very large number */
    unique->keysZ = 0;
    unique->dead = 0;
    unique->deadZ = 0;
    unique->gcFrac = DD_GC_FRAC_HI;
    unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
    unique->looseUpTo = looseUpTo;
    unique->gcEnabled = 1;
    unique->allocated = 0;
    unique->reclaimed = 0;
    unique->subtables = ABC_ALLOC(DdSubtable,unique->maxSize);
    if (unique->subtables == NULL) {
        ABC_FREE(unique);
        return(NULL);
    }
    unique->subtableZ = ABC_ALLOC(DdSubtable,unique->maxSizeZ);
    if (unique->subtableZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->perm = ABC_ALLOC(int,unique->maxSize);
    if (unique->perm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invperm = ABC_ALLOC(int,unique->maxSize);
    if (unique->invperm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->permZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->permZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invpermZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->invpermZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->map = NULL;
    unique->stack = ABC_ALLOC(DdNodePtr,ddMax(unique->maxSize,unique->maxSizeZ)+1);
    if (unique->stack == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->stack[0] = NULL; /* to suppress harmless UMR */

#ifndef DD_NO_DEATH_ROW
    unique->deathRowDepth = 1 << cuddComputeFloorLog2(unique->looseUpTo >> 2);
    unique->deathRow = ABC_ALLOC(DdNodePtr,unique->deathRowDepth);
    if (unique->deathRow == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (i = 0; i < unique->deathRowDepth; i++) {
        unique->deathRow[i] = NULL;
    }
    unique->nextDead = 0;
    unique->deadMask = unique->deathRowDepth - 1;
#endif

    for (i = 0; (unsigned) i < numVars; i++) {
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].keys = 0;
        unique->subtables[i].dead = 0;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->subtables[i].bindVar = 0;
        unique->subtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
        unique->subtables[i].pairIndex = 0;
        unique->subtables[i].varHandled = 0;
        unique->subtables[i].varToBeGrouped = CUDD_LAZY_NONE;

        nodelist = unique->subtables[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = sentinel;
        }
        unique->perm[i] = i;
        unique->invperm[i] = i;
    }
    for (i = 0; (unsigned) i < numVarsZ; i++) {
        unique->subtableZ[i].slots = slots;
        unique->subtableZ[i].shift = shift;
        unique->subtableZ[i].keys = 0;
        unique->subtableZ[i].dead = 0;
        unique->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        nodelist = unique->subtableZ[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; (unsigned) j < numVars; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtableZ[j].nodelist);
            }
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        unique->permZ[i] = i;
        unique->invpermZ[i] = i;
    }
    unique->constants.slots = slots;
    unique->constants.shift = shift;
    unique->constants.keys = 0;
    unique->constants.dead = 0;
    unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
    nodelist = unique->constants.nodelist = ABC_ALLOC(DdNodePtr,slots);
    if (nodelist == NULL) {
        for (j = 0; (unsigned) j < numVars; j++) {
            ABC_FREE(unique->subtables[j].nodelist);
        }
        ABC_FREE(unique->subtables);
        for (j = 0; (unsigned) j < numVarsZ; j++) {
            ABC_FREE(unique->subtableZ[j].nodelist);
        }
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (j = 0; (unsigned) j < slots; j++) {
        nodelist[j] = NULL;
    }

    unique->memoryList = NULL;
    unique->nextFree = NULL;

    unique->memused = sizeof(DdManager) + (unique->maxSize + unique->maxSizeZ)
        * (sizeof(DdSubtable) + 2 * sizeof(int)) + (numVars + 1) *
        slots * sizeof(DdNodePtr) +
        (ddMax(unique->maxSize,unique->maxSizeZ) + 1) * sizeof(DdNodePtr);
#ifndef DD_NO_DEATH_ROW
    unique->memused += unique->deathRowDepth * sizeof(DdNodePtr);
#endif

    /* Initialize fields concerned with automatic dynamic reordering */
    unique->reorderings = 0;
    unique->autoDyn = 0;        /* initially disabled */
    unique->autoDynZ = 0;       /* initially disabled */
    unique->realign = 0;        /* initially disabled */
    unique->realignZ = 0;       /* initially disabled */
    unique->reordered = 0;
    unique->autoMethod = CUDD_REORDER_SIFT;
    unique->autoMethodZ = CUDD_REORDER_SIFT;
    unique->nextDyn = DD_FIRST_REORDER;
    unique->countDead = ~0;
    unique->siftMaxVar = DD_SIFT_MAX_VAR;
    unique->siftMaxSwap = DD_SIFT_MAX_SWAPS;
    unique->tree = NULL;
    unique->treeZ = NULL;
    unique->groupcheck = CUDD_GROUP_CHECK7;
    unique->recomb = DD_DEFAULT_RECOMB;
    unique->symmviolation = 0;
    unique->arcviolation = 0;
    unique->populationSize = 0;
    unique->numberXovers = 0;
    unique->linear = NULL;
    unique->linearSize = 0;

    /* Initialize ZDD universe. */
    unique->univ = (DdNodePtr *)NULL;

    /* Initialize auxiliary fields. */
    unique->localCaches = NULL;
    unique->preGCHook = NULL;
    unique->postGCHook = NULL;
    unique->preReorderingHook = NULL;
    unique->postReorderingHook = NULL;
    unique->out = stdout;
    unique->err = stderr;
    unique->errorCode = CUDD_NO_ERROR;

    /* Initialize statistical counters. */
    unique->maxmemhard = ~ 0UL;
    unique->garbageCollections = 0;
    unique->GCTime = 0;
    unique->reordTime = 0;
#ifdef DD_STATS
    unique->nodesDropped = 0;
    unique->nodesFreed = 0;
#endif
    unique->peakLiveNodes = 0;
#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps = 0;
    unique->uniqueLinks = 0;
#endif
#ifdef DD_COUNT
    unique->recursiveCalls = 0;
    unique->swapSteps = 0;
#ifdef DD_STATS
    unique->nextSample = 250000;
#endif
#endif

    return(unique);

}